

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory64Lowering.cpp
# Opt level: O3

void __thiscall wasm::Memory64Lowering::visitMemorySize(Memory64Lowering *this,MemorySize *curr)

{
  Memory *pMVar1;
  MemorySize *local_30;
  Expression *size;
  
  pMVar1 = Module::getMemory((this->
                             super_WalkerPass<wasm::PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>_>
                             ).
                             super_PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
                             .
                             super_Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
                             .currModule,(Name)(curr->memory).super_IString.str);
  if ((pMVar1->indexType).id == 3) {
    local_30 = curr;
    extendAddress64(this,(Expression **)&local_30,(Name)(curr->memory).super_IString.str);
    (curr->ptrType).id = 2;
    Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>_>
                ).
                super_PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
                .super_Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>,
               (Expression *)local_30);
  }
  return;
}

Assistant:

void visitMemorySize(MemorySize* curr) {
    auto& module = *getModule();
    auto memory = module.getMemory(curr->memory);
    if (memory->is64()) {
      auto size = static_cast<Expression*>(curr);
      extendAddress64(size, curr->memory);
      curr->ptrType = Type::i32;
      replaceCurrent(size);
    }
  }